

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O0

void __thiscall
icu_63::CollationRuleParser::parseRelationStrings
          (CollationRuleParser *this,int32_t strength,int32_t i,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  UChar32 c;
  UChar32 prefix0;
  undefined1 local_f0 [2];
  UChar next;
  UnicodeString extension;
  undefined1 local_a0 [8];
  UnicodeString str;
  UnicodeString prefix;
  UErrorCode *errorCode_local;
  int32_t i_local;
  int32_t strength_local;
  CollationRuleParser *this_local;
  
  UnicodeString::UnicodeString((UnicodeString *)((long)&str.fUnion + 0x30));
  UnicodeString::UnicodeString((UnicodeString *)local_a0);
  UnicodeString::UnicodeString((UnicodeString *)local_f0);
  errorCode_local._0_4_ = parseTailoringString(this,i,(UnicodeString *)local_a0,errorCode);
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    iVar2 = UnicodeString::length(this->rules);
    if ((int32_t)errorCode_local < iVar2) {
      c._2_2_ = UnicodeString::charAt(this->rules,(int32_t)errorCode_local);
    }
    else {
      c._2_2_ = L'\0';
    }
    if (c._2_2_ == L'|') {
      UnicodeString::operator=
                ((UnicodeString *)((long)&str.fUnion + 0x30),(UnicodeString *)local_a0);
      errorCode_local._0_4_ =
           parseTailoringString
                     (this,(int32_t)errorCode_local + 1,(UnicodeString *)local_a0,errorCode);
      UVar1 = ::U_FAILURE(*errorCode);
      if (UVar1 != '\0') goto LAB_002ad7dd;
      iVar2 = UnicodeString::length(this->rules);
      if ((int32_t)errorCode_local < iVar2) {
        c._2_2_ = UnicodeString::charAt(this->rules,(int32_t)errorCode_local);
      }
      else {
        c._2_2_ = L'\0';
      }
    }
    if (c._2_2_ == L'/') {
      errorCode_local._0_4_ =
           parseTailoringString
                     (this,(int32_t)errorCode_local + 1,(UnicodeString *)local_f0,errorCode);
    }
    UVar1 = UnicodeString::isEmpty((UnicodeString *)((long)&str.fUnion + 0x30));
    if (UVar1 == '\0') {
      uVar3 = UnicodeString::char32At((UnicodeString *)((long)&str.fUnion + 0x30),0);
      uVar4 = UnicodeString::char32At((UnicodeString *)local_a0,0);
      iVar5 = (*(this->nfc->super_UObject)._vptr_UObject[0xf])(this->nfc,(ulong)uVar3);
      if (((char)iVar5 == '\0') ||
         (iVar5 = (*(this->nfc->super_UObject)._vptr_UObject[0xf])(this->nfc,(ulong)uVar4),
         (char)iVar5 == '\0')) {
        setParseError(this,"in \'prefix|str\', prefix and str must each start with an NFC boundary",
                      errorCode);
        goto LAB_002ad7dd;
      }
    }
    (*(this->sink->super_UObject)._vptr_UObject[4])
              (this->sink,(ulong)(uint)strength,(undefined1 *)((long)&str.fUnion + 0x30),local_a0,
               local_f0,&this->errorReason,errorCode);
    UVar1 = ::U_FAILURE(*errorCode);
    if (UVar1 != '\0') {
      setErrorContext(this);
    }
    this->ruleIndex = (int32_t)errorCode_local;
  }
LAB_002ad7dd:
  UnicodeString::~UnicodeString((UnicodeString *)local_f0);
  UnicodeString::~UnicodeString((UnicodeString *)local_a0);
  UnicodeString::~UnicodeString((UnicodeString *)((long)&str.fUnion + 0x30));
  return;
}

Assistant:

void
CollationRuleParser::parseRelationStrings(int32_t strength, int32_t i, UErrorCode &errorCode) {
    // Parse
    //     prefix | str / extension
    // where prefix and extension are optional.
    UnicodeString prefix, str, extension;
    i = parseTailoringString(i, str, errorCode);
    if(U_FAILURE(errorCode)) { return; }
    UChar next = (i < rules->length()) ? rules->charAt(i) : 0;
    if(next == 0x7c) {  // '|' separates the context prefix from the string.
        prefix = str;
        i = parseTailoringString(i + 1, str, errorCode);
        if(U_FAILURE(errorCode)) { return; }
        next = (i < rules->length()) ? rules->charAt(i) : 0;
    }
    if(next == 0x2f) {  // '/' separates the string from the extension.
        i = parseTailoringString(i + 1, extension, errorCode);
    }
    if(!prefix.isEmpty()) {
        UChar32 prefix0 = prefix.char32At(0);
        UChar32 c = str.char32At(0);
        if(!nfc.hasBoundaryBefore(prefix0) || !nfc.hasBoundaryBefore(c)) {
            setParseError("in 'prefix|str', prefix and str must each start with an NFC boundary",
                          errorCode);
            return;
        }
    }
    sink->addRelation(strength, prefix, str, extension, errorReason, errorCode);
    if(U_FAILURE(errorCode)) { setErrorContext(); }
    ruleIndex = i;
}